

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QGraphicsWidget * __thiscall QGraphicsItem::topLevelWidget(QGraphicsItem *this)

{
  bool bVar1;
  QGraphicsWidget *this_00;
  QGraphicsItem *in_RDI;
  QGraphicsWidget *p;
  QGraphicsWidget *local_30;
  QGraphicsWidget *local_28;
  QGraphicsWidget *local_8;
  
  this_00 = parentWidget(in_RDI);
  if (this_00 == (QGraphicsWidget *)0x0) {
    bVar1 = isWidget((QGraphicsItem *)0x978648);
    if (bVar1) {
      if (in_RDI == (QGraphicsItem *)0x0) {
        local_28 = (QGraphicsWidget *)0x0;
      }
      else {
        local_28 = (QGraphicsWidget *)(in_RDI + -1);
      }
      local_30 = local_28;
    }
    else {
      local_30 = (QGraphicsWidget *)0x0;
    }
    local_8 = local_30;
  }
  else {
    local_8 = topLevelWidget((QGraphicsItem *)this_00);
  }
  return local_8;
}

Assistant:

QGraphicsWidget *QGraphicsItem::topLevelWidget() const
{
    if (const QGraphicsWidget *p = parentWidget())
        return p->topLevelWidget();
    return isWidget() ? static_cast<QGraphicsWidget *>(const_cast<QGraphicsItem *>(this)) : nullptr;
}